

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit> *ps)

{
  Lit *pLVar1;
  lbool *plVar2;
  FILE *__stream;
  uchar *puVar3;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  CRef CVar9;
  undefined8 in_RAX;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  byte bVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  CRef cr;
  undefined8 uStack_38;
  
  if (this->ok == true) {
    uStack_38 = in_RAX;
    if (this->check_satisfiability == true) {
      SATchecker::addClause(&this->satChecker,ps);
    }
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(ps->data);
    if (this->drup_file != (FILE *)0x0) {
      if ((this->add_oc).data != (Lit *)0x0) {
        (this->add_oc).sz = 0;
      }
      if (0 < ps->sz) {
        lVar17 = 0;
        lVar19 = 0;
        do {
          vec<Minisat::Lit>::push(&this->add_oc,(Lit *)((long)&ps->data->x + lVar17));
          lVar19 = lVar19 + 1;
          lVar17 = lVar17 + 4;
        } while (lVar19 < ps->sz);
      }
    }
    iVar8 = ps->sz;
    if (iVar8 < 1) {
      iVar13 = 0;
      uVar18 = 1;
      uVar15 = 1;
      lVar17 = 0;
    }
    else {
      pLVar1 = ps->data;
      plVar2 = (this->assigns).data;
      lVar17 = 0;
      uVar15 = 0xfffffffe;
      iVar13 = 0;
      uVar18 = 0;
      bVar14 = 0;
      do {
        uVar10 = pLVar1[lVar17].x;
        bVar20 = plVar2[(int)uVar10 >> 1].value;
        bVar16 = (byte)uVar10;
        if (bVar20 == (bVar16 & 1)) {
          return true;
        }
        if ((uVar10 ^ uVar15) == 1) {
          return true;
        }
        bVar20 = bVar20 ^ bVar16 & 1;
        if ((bVar20 == 1) || (uVar10 == uVar15)) {
          bVar6 = bVar14;
          if (bVar20 == 1) {
            bVar6 = bVar16 ^ 1;
            if ((bVar14 & 1) != 0) {
              bVar6 = 1;
            }
            uVar5 = uVar18 & 1;
            uVar18 = uVar10;
            if (uVar5 != 0) {
              uVar18 = 1;
            }
          }
        }
        else {
          lVar19 = (long)iVar13;
          iVar13 = iVar13 + 1;
          pLVar1[lVar19].x = uVar10;
          bVar6 = bVar16 ^ 1;
          if ((bVar14 & 1) != 0) {
            bVar6 = 1;
          }
          uVar5 = uVar18 & 1;
          uVar15 = uVar10;
          uVar18 = uVar10;
          if (uVar5 != 0) {
            uVar18 = 1;
          }
        }
        lVar17 = lVar17 + 1;
        iVar8 = ps->sz;
        bVar14 = bVar6;
      } while (lVar17 < iVar8);
      uVar15 = (uint)(~bVar6 & 1);
      uVar18 = (uint)(~(byte)uVar18 & 1);
    }
    iVar11 = (int)lVar17;
    if (iVar11 - iVar13 != 0 && iVar13 <= iVar11) {
      ps->sz = iVar8 - (iVar11 - iVar13);
    }
    this->solved_by_ls = false;
    if (iVar11 != iVar13 && this->drup_file != (FILE *)0x0) {
      binDRUP<Minisat::vec<Minisat::Lit>>(this,'a',ps,this->drup_file);
      __stream = (FILE *)this->drup_file;
      puVar3 = this->buf_ptr;
      this->buf_ptr = puVar3 + 1;
      *puVar3 = 'd';
      this->buf_len = this->buf_len + 1;
      if ((this->onlineDratChecker != (OnlineProofChecker *)0x0) &&
         (bVar7 = OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>
                            (this->onlineDratChecker,&this->add_oc), !bVar7)) {
        exit(0x86);
      }
      if (0 < (this->add_oc).sz) {
        lVar17 = 0;
        do {
          uVar10 = (this->add_oc).data[lVar17].x + 2;
          uVar12 = (ulong)uVar10;
          do {
            pbVar4 = this->buf_ptr;
            this->buf_ptr = pbVar4 + 1;
            *pbVar4 = (byte)uVar10 | 0x80;
            this->buf_len = this->buf_len + 1;
            uVar12 = uVar12 >> 7;
            bVar7 = 0x7f < uVar10;
            uVar10 = (uint)uVar12;
          } while (bVar7);
          this->buf_ptr[-1] = this->buf_ptr[-1] & 0x7f;
          lVar17 = lVar17 + 1;
        } while (lVar17 < (this->add_oc).sz);
      }
      puVar3 = this->buf_ptr;
      this->buf_ptr = puVar3 + 1;
      *puVar3 = '\0';
      iVar8 = this->buf_len;
      uVar10 = iVar8 + 1;
      this->buf_len = uVar10;
      if (0xfffff < iVar8) {
        fwrite_unlocked(drup_buf,1,(ulong)uVar10,__stream);
        this->buf_ptr = drup_buf;
        this->buf_len = 0;
      }
    }
    if (ps->sz == 1) {
      uncheckedEnqueue(this,(Lit)ps->data->x,0,0xffffffff);
      CVar9 = propagate(this);
      this->ok = CVar9 == 0xffffffff;
      return CVar9 == 0xffffffff;
    }
    if (ps->sz != 0) {
      uStack_38._4_4_ = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(&this->ca,ps,false);
      vec<unsigned_int>::push(&this->clauses,(uint *)((long)&uStack_38 + 4));
      attachClause(this,uStack_38._4_4_);
      if (this->systematic_branching_state == 0) {
        this->posMissingInSome = this->posMissingInSome + uVar15;
        this->negMissingInSome = this->negMissingInSome + uVar18;
      }
      return true;
    }
    this->ok = false;
  }
  return false;
}

Assistant:

bool Solver::addClause_(vec<Lit> &ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    if (check_satisfiability) satChecker.addClause(ps); // add for SAT check tracking

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p;
    int i, j;

    bool somePositive = false;
    bool someNegative = false;

    TRACE(if (verbosity > 2) std::cout << "c adding clause " << ps << std::endl);

    if (drup_file) {
        add_oc.clear();
        for (int i = 0; i < ps.size(); i++) add_oc.push(ps[i]);
    }

    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p) {
            ps[j++] = p = ps[i];
            somePositive = somePositive || !sign(p);
            someNegative = someNegative || sign(p);
        } else if (value(ps[i]) == l_False) {
            // for polarity analysis, we ignore unit propagation
            somePositive = somePositive || !sign(ps[i]);
            someNegative = someNegative || sign(ps[i]);
        }
    ps.shrink(i - j);

    /* if there are new clauses, we cannot claim that SLS solved the formula anymore */
    solved_by_ls = false;

    if (drup_file && i != j) {
#ifdef BIN_DRUP
        binDRUP('a', ps, drup_file);
        binDRUP('d', add_oc, drup_file);
#else
        for (int i = 0; i < ps.size(); i++) fprintf(drup_file, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
        fprintf(drup_file, "0\n");

        fprintf(drup_file, "d ");
        for (int i = 0; i < add_oc.size(); i++)
            fprintf(drup_file, "%i ", (var(add_oc[i]) + 1) * (-2 * sign(add_oc[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1) {
        uncheckedEnqueue(ps[0], 0);
        return ok = (propagate() == CRef_Undef);
    } else {
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
        // memorize for the whole formula to feed polarity heuristic
        if (systematic_branching_state == 0) {
            posMissingInSome = somePositive ? posMissingInSome : posMissingInSome + 1;
            negMissingInSome = someNegative ? negMissingInSome : negMissingInSome + 1;
        }
    }

    return true;
}